

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

void __thiscall MutableBuffer::push(MutableBuffer *this,char *str)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,str,&local_31);
  push(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void push(const char *str) { push(std::string(str)); }